

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65694::CtorEvalExternalInterface::applyToModule(CtorEvalExternalInterface *this)

{
  bool bVar1;
  CtorEvalExternalInterface *this_local;
  
  clearApplyState(this);
  bVar1 = std::
          unordered_map<wasm::Name,_std::vector<char,_std::allocator<char>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::empty(&this->memories);
  if (!bVar1) {
    applyMemoryToModule(this);
  }
  applyGlobalsToModule(this);
  return;
}

Assistant:

void applyToModule() {
    clearApplyState();

    // If nothing was ever written to memories then there is nothing to update.
    if (!memories.empty()) {
      applyMemoryToModule();
    }

    applyGlobalsToModule();
  }